

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

ByteData256 * __thiscall
cfd::ConfidentialTransactionContext::CreateSignatureHashByTaproot
          (ByteData256 *__return_storage_ptr__,ConfidentialTransactionContext *this,
          OutPoint *outpoint,SigHashType *sighash_type,ByteData256 *tap_leaf_hash,
          uint32_t *code_separator_position,ByteData *annex)

{
  pointer pCVar1;
  ByteData256 *object;
  ByteData256 *__return_storage_ptr___00;
  pointer puVar2;
  bool bVar3;
  uint32_t uVar4;
  CfdException *pCVar5;
  AbstractTxIn *this_00;
  TapScriptData *this_01;
  long lVar6;
  ulong uVar7;
  allocator local_7e1;
  uint32_t *local_7e0;
  SigHashType *local_7d8;
  OutPoint *local_7d0;
  ByteData256 *local_7c8;
  ByteData256 *local_7c0;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> utxos;
  ByteData annex_data;
  TapScriptData script_data;
  SigHashType local_724;
  OutPoint target_outpoint;
  BlockHash genesis_blockhash;
  ConfidentialAssetId asset;
  UtxoData utxo;
  
  local_7e0 = code_separator_position;
  local_7d8 = sighash_type;
  local_7d0 = outpoint;
  local_7c8 = tap_leaf_hash;
  local_7c0 = __return_storage_ptr__;
  UtxoData::UtxoData(&utxo);
  utxos.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  utxos.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  utxos.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar6 = 0;
  uVar7 = 0;
  do {
    pCVar1 = (this->super_ConfidentialTransaction).vin_.
             super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->super_ConfidentialTransaction).vin_.
                       super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x160) <= uVar7)
    {
      GetGenesisBlockHash(&genesis_blockhash,this);
      uVar4 = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
                _vptr_AbstractTransaction[0xf])(this,local_7d0);
      __return_storage_ptr___00 = local_7c0;
      object = local_7c8;
      core::ByteData::ByteData(&annex_data);
      if (annex != (ByteData *)0x0) {
        core::ByteData::operator=(&annex_data,annex);
      }
      this_01 = &script_data;
      core::TapScriptData::TapScriptData(this_01);
      if (object != (ByteData256 *)0x0) {
        core::ByteData256::operator=(&script_data.tap_leaf_hash,object);
        if (local_7e0 != (uint32_t *)0x0) {
          script_data.code_separator_position = *local_7e0;
        }
      }
      core::SigHashType::SigHashType(&local_724,local_7d8);
      if (object == (ByteData256 *)0x0) {
        this_01 = (TapScriptData *)0x0;
      }
      core::ConfidentialTransaction::GetElementsSchnorrSignatureHash
                (__return_storage_ptr___00,&this->super_ConfidentialTransaction,uVar4,&local_724,
                 &genesis_blockhash,&utxos,this_01,&annex_data);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script_data);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&annex_data);
      core::BlockHash::~BlockHash(&genesis_blockhash);
      std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
      ~vector(&utxos);
      UtxoData::~UtxoData(&utxo);
      return __return_storage_ptr___00;
    }
    this_00 = (AbstractTxIn *)((long)&(pCVar1->super_AbstractTxIn)._vptr_AbstractTxIn + lVar6);
    core::AbstractTxIn::GetTxid((Txid *)&genesis_blockhash,this_00);
    uVar4 = core::AbstractTxIn::GetVout(this_00);
    core::OutPoint::OutPoint(&target_outpoint,(Txid *)&genesis_blockhash,uVar4);
    core::Txid::~Txid((Txid *)&genesis_blockhash);
    bVar3 = IsFindUtxoMap(this,&target_outpoint,&utxo);
    if (!bVar3) {
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&genesis_blockhash,
                 "Utxo is not found. CreateSignatureHashByTaproot fail.",(allocator *)&script_data);
      core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&genesis_blockhash);
      __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::Script::Script((Script *)&annex_data,&utxo.locking_script);
    core::Address::GetAddress_abi_cxx11_((string *)&genesis_blockhash,&utxo.address);
    puVar2 = genesis_blockhash.data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)&genesis_blockhash);
    if (puVar2 == (pointer)0x0) {
      if (utxo.descriptor._M_string_length != 0) {
        core::Descriptor::ParseElements((Descriptor *)&genesis_blockhash,&utxo.descriptor);
        core::Descriptor::GetLockingScript((Script *)&script_data,(Descriptor *)&genesis_blockhash);
        core::Script::operator=((Script *)&annex_data,(Script *)&script_data);
        core::Script::~Script((Script *)&script_data);
        core::DescriptorNode::~DescriptorNode((DescriptorNode *)&genesis_blockhash);
      }
    }
    else {
      core::Address::GetLockingScript((Script *)&genesis_blockhash,&utxo.address);
      core::Script::operator=((Script *)&annex_data,(Script *)&genesis_blockhash);
      core::Script::~Script((Script *)&genesis_blockhash);
    }
    core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&script_data,&utxo.amount);
    core::ConfidentialAssetId::ConfidentialAssetId(&asset,&utxo.asset);
    bVar3 = core::ConfidentialValue::HasBlinding(&utxo.value_commitment);
    if (bVar3) {
      core::ConfidentialValue::operator=((ConfidentialValue *)&script_data,&utxo.value_commitment);
      bVar3 = core::ConfidentialAssetId::HasBlinding(&asset);
      if (!bVar3) {
        bVar3 = core::ConfidentialAssetId::HasBlinding(&utxo.asset_commitment);
        if (bVar3) {
          core::ConfidentialAssetId::operator=(&asset,&utxo.asset_commitment);
        }
        else {
          bVar3 = core::BlindFactor::IsEmpty(&utxo.asset_blind_factor);
          if (bVar3) {
LAB_003595a1:
            pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string
                      ((string *)&genesis_blockhash,
                       "Utxo asset and blindFactor is unmatch. CreateSignatureHashByTaproot fail.",
                       &local_7e1);
            core::CfdException::CfdException
                      (pCVar5,kCfdIllegalStateError,(string *)&genesis_blockhash);
            __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
          }
          bVar3 = core::BlindFactor::IsEmpty(&utxo.amount_blind_factor);
          if (bVar3) goto LAB_003595a1;
          core::ConfidentialAssetId::GetCommitment
                    ((ConfidentialAssetId *)&genesis_blockhash,&asset,&utxo.asset_blind_factor);
          core::ConfidentialAssetId::operator=(&asset,(ConfidentialAssetId *)&genesis_blockhash);
          core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&genesis_blockhash)
          ;
        }
      }
    }
    else {
      bVar3 = core::ConfidentialAssetId::HasBlinding(&asset);
      if (bVar3) {
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&genesis_blockhash,
                   "Utxo asset is unmatch. CreateSignatureHashByTaproot fail.",&local_7e1);
        core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&genesis_blockhash);
        __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
    }
    core::ConfidentialTxOut::ConfidentialTxOut
              ((ConfidentialTxOut *)&genesis_blockhash,(Script *)&annex_data,&asset,
               (ConfidentialValue *)&script_data);
    std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
    emplace_back<cfd::core::ConfidentialTxOut>(&utxos,(ConfidentialTxOut *)&genesis_blockhash);
    core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)&genesis_blockhash);
    core::ConfidentialAssetId::~ConfidentialAssetId(&asset);
    core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&script_data);
    core::Script::~Script((Script *)&annex_data);
    core::Txid::~Txid(&target_outpoint.txid_);
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x160;
  } while( true );
}

Assistant:

ByteData256 ConfidentialTransactionContext::CreateSignatureHashByTaproot(
    const OutPoint& outpoint, const SigHashType& sighash_type,
    const ByteData256* tap_leaf_hash, const uint32_t* code_separator_position,
    const ByteData* annex) const {
  UtxoData utxo;
  std::vector<ConfidentialTxOut> utxos;
  for (size_t index = 0; index < vin_.size(); ++index) {
    const auto& txin_ref = vin_[index];
    OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    if (!IsFindUtxoMap(target_outpoint, &utxo)) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Utxo is not found. CreateSignatureHashByTaproot fail.");
    }
    Script locking_script = GetLockingScriptFromUtxoData(utxo);
    ConfidentialValue value(utxo.amount);
    ConfidentialAssetId asset = utxo.asset;
    if (utxo.value_commitment.HasBlinding()) {
      value = utxo.value_commitment;
      if (asset.HasBlinding()) {
        // fall-through
      } else if (utxo.asset_commitment.HasBlinding()) {
        asset = utxo.asset_commitment;
      } else if (
          utxo.asset_blind_factor.IsEmpty() ||
          utxo.amount_blind_factor.IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Utxo asset and blindFactor is unmatch. "
            "CreateSignatureHashByTaproot fail.");  // NOLINT
      } else {
        asset =
            ConfidentialAssetId::GetCommitment(asset, utxo.asset_blind_factor);
      }
    } else if (asset.HasBlinding()) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Utxo asset is unmatch. CreateSignatureHashByTaproot fail.");
    }
    utxos.emplace_back(ConfidentialTxOut(locking_script, asset, value));
  }
  BlockHash genesis_blockhash = GetGenesisBlockHash();

  uint32_t txin_index = GetTxInIndex(outpoint);
  ByteData annex_data;
  if (annex != nullptr) annex_data = *annex;
  TapScriptData script_data;
  if (tap_leaf_hash != nullptr) {
    script_data.tap_leaf_hash = *tap_leaf_hash;
    if (code_separator_position != nullptr) {
      script_data.code_separator_position = *code_separator_position;
    }
  }

  return GetElementsSchnorrSignatureHash(
      txin_index, sighash_type, genesis_blockhash, utxos,
      (tap_leaf_hash != nullptr) ? &script_data : nullptr, annex_data);
}